

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintStamp.cpp
# Opt level: O0

void __thiscall OpenMD::ConstraintStamp::ConstraintStamp(ConstraintStamp *this)

{
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
  __s;
  undefined1 uVar1;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_bool>
  pVar2;
  string *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  value_type *in_stack_fffffffffffffe58;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *in_stack_fffffffffffffe60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *this_00;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  char *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_119;
  string local_118 [78];
  bool local_ca;
  allocator<char> local_c9;
  string local_c8 [32];
  _Base_ptr local_a8;
  undefined1 local_a0;
  undefined8 *local_98;
  allocator<char> local_89;
  string local_88 [79];
  allocator<char> local_39;
  string local_38 [56];
  
  DataHolder::DataHolder
            ((DataHolder *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  *in_RDI = &PTR__ConstraintStamp_005020d8;
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  Parameter<bool>::Parameter
            ((Parameter<bool> *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe48);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_fffffffffffffe88,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  local_98 = in_RDI + 0xd;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->first,
             (ParameterBase **)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  __s = pVar2.first._M_node;
  uVar1 = pVar2.second;
  local_a8 = __s._M_node;
  local_a0 = uVar1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x339e2e);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)__s._M_node,
             (allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffffe80));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe48);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x14),true);
  local_ca = false;
  Parameter<bool>::setDefaultValue((Parameter<bool> *)(in_RDI + 0x14),&local_ca);
  this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
             *)(in_RDI + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)__s._M_node,
             (allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffffe80));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (this_00,&in_stack_fffffffffffffe58->first,
             (ParameterBase **)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
            *)this_00,in_stack_fffffffffffffe58);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x339f9d);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  return;
}

Assistant:

ConstraintStamp::ConstraintStamp() {
    DefineParameter(ConstrainedDistance, "constrainedDistance");
    DefineOptionalParameterWithDefaultValue(PrintConstraintForce,
                                            "printConstraintForce", false);
  }